

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::exit(App *this,int __status)

{
  long lVar1;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *__args_1;
  string *this_00;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  __args_1 = (Error *)CONCAT44(in_register_00000034,__status);
  lVar1 = __dynamic_cast(__args_1,&Error::typeinfo,&RuntimeError::typeinfo);
  if (lVar1 == 0) {
    lVar1 = __dynamic_cast(__args_1,&Error::typeinfo,&CallForHelp::typeinfo);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(__args_1,&Error::typeinfo,&CallForAllHelp::typeinfo,0);
      if (lVar1 == 0) {
        if (__args_1->exit_code == 0) {
          return;
        }
        if ((this->failure_message_).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
        ::operator()(&local_88,&this->failure_message_,this,__args_1);
        ::std::operator<<(in_RCX,(string *)&local_88);
        ::std::ostream::flush();
        ::std::__cxx11::string::~string((string *)&local_88);
        return;
      }
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_89);
      help(&local_88,this,&local_68,All);
      ::std::operator<<(in_RDX,(string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      this_00 = &local_68;
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_89);
      help(&local_88,this,&local_48,Normal);
      ::std::operator<<(in_RDX,(string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      this_00 = &local_48;
    }
    ::std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

int exit(const Error &e, std::ostream &out = std::cout, std::ostream &err = std::cerr) const {

        /// Avoid printing anything if this is a CLI::RuntimeError
        if(dynamic_cast<const CLI::RuntimeError *>(&e) != nullptr)
            return e.get_exit_code();

        if(dynamic_cast<const CLI::CallForHelp *>(&e) != nullptr) {
            out << help();
            return e.get_exit_code();
        }

        if(dynamic_cast<const CLI::CallForAllHelp *>(&e) != nullptr) {
            out << help("", AppFormatMode::All);
            return e.get_exit_code();
        }

        if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
            if(failure_message_)
                err << failure_message_(this, e) << std::flush;
        }

        return e.get_exit_code();
    }